

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O0

bool draco::GeometryAttribute::ConvertComponentValue<double,unsigned_int>
               (double *in_value,bool normalized,uint *out_value)

{
  uint uVar1;
  undefined4 *in_RDX;
  byte in_SIL;
  double *in_RDI;
  double dVar2;
  
  uVar1 = std::isnan(*in_RDI);
  if (((uVar1 & 1) != 0) || (uVar1 = std::isinf(*in_RDI), (uVar1 & 1) != 0)) {
    return false;
  }
  dVar2 = *in_RDI;
  uVar1 = std::numeric_limits<unsigned_int>::min();
  if (((double)uVar1 <= dVar2) &&
     (dVar2 = *in_RDI, uVar1 = std::numeric_limits<unsigned_int>::max(), dVar2 < (double)uVar1)) {
    if ((in_SIL & 1) == 0) {
      *in_RDX = (int)(long)*in_RDI;
    }
    else {
      if ((1.0 < *in_RDI) || (*in_RDI <= 0.0 && *in_RDI != 0.0)) {
        return false;
      }
      dVar2 = *in_RDI;
      uVar1 = std::numeric_limits<unsigned_int>::max();
      dVar2 = floor(dVar2 * (double)uVar1 + 0.5);
      *in_RDX = (int)(long)dVar2;
    }
    return true;
  }
  return false;
}

Assistant:

static bool ConvertComponentValue(const T &in_value, bool normalized,
                                    OutT *out_value) {
    // Make sure the |in_value| can be represented as an integral type OutT.
    if (std::is_integral<OutT>::value) {
      // Make sure the |in_value| fits within the range of values that OutT
      // is able to represent. Perform the check only for integral types.
      if (!std::is_same<T, bool>::value && std::is_integral<T>::value) {
        static constexpr OutT kOutMin =
            std::is_signed<T>::value ? std::numeric_limits<OutT>::min() : 0;
        if (in_value < kOutMin || in_value > std::numeric_limits<OutT>::max()) {
          return false;
        }
      }

      // Check conversion of floating point |in_value| to integral value OutT.
      if (std::is_floating_point<T>::value) {
        // Make sure the floating point |in_value| is not NaN and not Inf as
        // integral type OutT is unable to represent these values.
        if (sizeof(in_value) > sizeof(double)) {
          if (std::isnan(static_cast<long double>(in_value)) ||
              std::isinf(static_cast<long double>(in_value))) {
            return false;
          }
        } else if (sizeof(in_value) > sizeof(float)) {
          if (std::isnan(static_cast<double>(in_value)) ||
              std::isinf(static_cast<double>(in_value))) {
            return false;
          }
        } else {
          if (std::isnan(static_cast<float>(in_value)) ||
              std::isinf(static_cast<float>(in_value))) {
            return false;
          }
        }

        // Make sure the floating point |in_value| fits within the range of
        // values that integral type OutT is able to represent.
        if (in_value < std::numeric_limits<OutT>::min() ||
            in_value >= std::numeric_limits<OutT>::max()) {
          return false;
        }
      }
    }

    if (std::is_integral<T>::value && std::is_floating_point<OutT>::value &&
        normalized) {
      // When converting integer to floating point, normalize the value if
      // necessary.
      *out_value = static_cast<OutT>(in_value);
      *out_value /= static_cast<OutT>(std::numeric_limits<T>::max());
    } else if (std::is_floating_point<T>::value &&
               std::is_integral<OutT>::value && normalized) {
      // Converting from floating point to a normalized integer.
      if (in_value > 1 || in_value < 0) {
        // Normalized float values need to be between 0 and 1.
        return false;
      }
      // TODO(ostava): Consider allowing float to normalized integer conversion
      // for 64-bit integer types. Currently it doesn't work because we don't
      // have a floating point type that could store all 64 bit integers.
      if (sizeof(OutT) > 4) {
        return false;
      }
      // Expand the float to the range of the output integer and round it to the
      // nearest representable value. Use doubles for the math to ensure the
      // integer values are represented properly during the conversion process.
      *out_value = static_cast<OutT>(std::floor(
          in_value * static_cast<double>(std::numeric_limits<OutT>::max()) +
          0.5));
    } else {
      *out_value = static_cast<OutT>(in_value);
    }

    // TODO(ostava): Add handling of normalized attributes when converting
    // between different integer representations. If the attribute is
    // normalized, integer values should be converted as if they represent 0-1
    // range. E.g. when we convert uint16 to uint8, the range <0, 2^16 - 1>
    // should be converted to range <0, 2^8 - 1>.
    return true;
  }